

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O2

int fill_with_entropy(uint8_t *out,size_t len,int block,int seed)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 1;
  if (len != 0) {
    CRYPTO_init_sysrand();
    if (block != 0) {
      CRYPTO_once(&wait_for_entropy_once,wait_for_entropy);
    }
    piVar1 = __errno_location();
    *piVar1 = 0;
    do {
      if (len == 0) {
        return 1;
      }
      if (urandom_fd == -3) {
        lVar2 = boringssl_getrandom(out,len,(uint)(block == 0));
      }
      else {
        while (lVar2 = read(urandom_fd,out,len), lVar2 == -1) {
          if (*piVar1 != 4) goto LAB_00402009;
        }
      }
      out = out + lVar2;
      len = len - lVar2;
    } while (0 < lVar2);
LAB_00402009:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int fill_with_entropy(uint8_t *out, size_t len, int block, int seed) {
  if (len == 0) {
    return 1;
  }

#if defined(USE_NR_getrandom) || defined(FREEBSD_GETRANDOM)
  int getrandom_flags = 0;
  if (!block) {
    getrandom_flags |= GRND_NONBLOCK;
  }
#endif

#if defined(USE_NR_getrandom)
  if (seed) {
    getrandom_flags |= extra_getrandom_flags_for_seed;
  }
#endif

  CRYPTO_init_sysrand();
  if (block) {
    CRYPTO_once(&wait_for_entropy_once, wait_for_entropy);
  }

  // Clear |errno| so it has defined value if |read| or |getrandom|
  // "successfully" returns zero.
  errno = 0;
  while (len > 0) {
    ssize_t r;

    if (urandom_fd == kHaveGetrandom) {
#if defined(USE_NR_getrandom)
      r = boringssl_getrandom(out, len, getrandom_flags);
#else  // USE_NR_getrandom
      fprintf(stderr, "urandom fd corrupt.\n");
      abort();
#endif
    } else {
      do {
        r = read(urandom_fd, out, len);
      } while (r == -1 && errno == EINTR);
    }

    if (r <= 0) {
      return 0;
    }
    out += r;
    len -= r;
  }

  return 1;
}